

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_measures.cc
# Opt level: O2

S1Angle S2::GetLength(S2Shape *shape)

{
  int iVar1;
  int chain_id;
  S1Angle SVar2;
  S2PointSpan polyline;
  double local_50;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> vertices;
  
  iVar1 = (*shape->_vptr_S2Shape[4])();
  local_50 = 0.0;
  if (iVar1 == 1) {
    vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar1 = (*shape->_vptr_S2Shape[6])(shape);
    chain_id = 0;
    if (iVar1 < 1) {
      iVar1 = 0;
    }
    local_50 = 0.0;
    for (; iVar1 != chain_id; chain_id = chain_id + 1) {
      GetChainVertices(shape,chain_id,&vertices);
      polyline.len_ =
           ((long)vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start) % 0x18;
      polyline.ptr_ =
           (pointer)(((long)vertices.
                            super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)vertices.
                           super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                           _M_impl.super__Vector_impl_data._M_start) / 0x18);
      SVar2 = GetLength((S2 *)vertices.
                              super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,polyline);
      local_50 = local_50 + SVar2.radians_;
    }
    std::_Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>::~_Vector_base
              (&vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>);
  }
  return (S1Angle)local_50;
}

Assistant:

S1Angle GetLength(const S2Shape& shape) {
  if (shape.dimension() != 1) return S1Angle::Zero();
  S1Angle length;
  vector<S2Point> vertices;
  int num_chains = shape.num_chains();
  for (int chain_id = 0; chain_id < num_chains; ++chain_id) {
    GetChainVertices(shape, chain_id, &vertices);
    length += S2::GetLength(vertices);
  }
  return length;
}